

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-kalman-filter.hxx
# Opt level: O1

StateVector * __thiscall
stateObservation::compileTime::KalmanFilter<4U,_3U,_2U>::prediction_
          (StateVector *__return_storage_ptr__,KalmanFilter<4U,_3U,_2U> *this,uint k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  _Elt_pointer pIVar25;
  ulong uVar26;
  char *__function;
  ulong uVar27;
  
  if ((this->super_KalmanFilterBase<4U,_3U,_2U>).a_.isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 4>::check_() const [r = 4, c = 4]";
  }
  else if ((this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_.isSet_
           == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]";
  }
  else if ((this->b_).isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<4, 2>::check_() const [r = 4, c = 2]";
  }
  else {
    pIVar25 = (this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.u_.
              super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar26 = (long)pIVar25 -
             (long)*(_Elt_pointer *)
                    ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                            super_ZeroDelayObserver<4U,_3U,_2U>.u_.
                            super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
                            ._M_impl.super__Deque_impl_data._M_start + 8) >> 5;
    if (0xf < uVar26) {
      uVar27 = uVar26 >> 4 | 0xf000000000000000;
      if (0 < (long)uVar26) {
        uVar27 = uVar26 >> 4;
      }
      pIVar25 = (*(_Map_pointer *)
                  ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                          super_ZeroDelayObserver<4U,_3U,_2U>.u_.
                          super__Deque_base<stateObservation::compileTime::IndexedMatrix<2U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<2U,_1U>_>_>
                          ._M_impl.super__Deque_impl_data._M_start + 0x18))[uVar27] +
                uVar26 + uVar27 * -0x10;
    }
    if (pIVar25->isSet_ != false) {
      dVar3 = (this->super_KalmanFilterBase<4U,_3U,_2U>).super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
      ;
      dVar4 = *(double *)
               ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                       super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 8);
      dVar5 = *(double *)
               ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                       super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
      dVar6 = *(double *)
               ((long)&(this->super_KalmanFilterBase<4U,_3U,_2U>).
                       super_ZeroDelayObserver<4U,_3U,_2U>.x_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x18);
      dVar7 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[2];
      dVar8 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[3];
      dVar9 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
              m_data.array[6];
      dVar10 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
               m_data.array[7];
      dVar11 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 8);
      dVar12 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x28);
      dVar13 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x48);
      dVar14 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x68);
      dVar15 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x10);
      dVar16 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x18);
      dVar17 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x30);
      dVar18 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x38);
      dVar19 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x50);
      dVar20 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x58);
      dVar21 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x70);
      dVar22 = *(double *)
                ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 0x78);
      dVar1 = (pIVar25->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[0];
      dVar2 = (pIVar25->v_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[1];
      dVar23 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
               m_data.array[1];
      dVar24 = (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
               m_data.array[5];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[0] =
           (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
           m_data.array[4] * dVar2 +
           (this->b_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>.m_storage.
           m_data.array[0] * dVar1 +
           *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x60) * dVar6 +
           *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x40) * dVar5 +
           *(double *)
            ((long)(this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                   array + 0x20) * dVar4 +
           (this->super_KalmanFilterBase<4U,_3U,_2U>).a_.v_.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] *
           dVar3;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[1] =
           dVar24 * dVar2 + dVar23 * dVar1 +
           dVar14 * dVar6 + dVar13 * dVar5 + dVar12 * dVar4 + dVar11 * dVar3;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[2] =
           dVar2 * dVar9 + dVar1 * dVar7 +
           dVar6 * dVar21 + dVar5 * dVar19 + dVar4 * dVar17 + dVar3 * dVar15;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[3] =
           dVar2 * dVar10 + dVar1 * dVar8 +
           dVar6 * dVar22 + dVar5 * dVar20 + dVar4 * dVar18 + dVar3 * dVar16;
      return __return_storage_ptr__;
    }
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<2, 1>::check_() const [r = 2, c = 1]";
  }
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,__function);
}

Assistant:

typename ObserverBase<n,m,p>::StateVector KalmanFilter<n,m,p>::prediction_(unsigned k)
{
    (void)k; //unused

    if (p>0)
        return this->a_()*this->x_()+this->b_()*this->u_[0]();
    else
        return typename ObserverBase<n,m,p>::StateVector(this->a_()*this->x_());

}